

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O1

void __thiscall ScriptException::Free(ScriptException *this)

{
  BSTR pWVar1;
  
  this->ichMin = 0;
  this->ichLim = 0;
  pWVar1 = (this->ei).bstrSource;
  if (pWVar1 != (BSTR)0x0) {
    SysFreeString(pWVar1);
  }
  pWVar1 = (this->ei).bstrDescription;
  if (pWVar1 != (BSTR)0x0) {
    SysFreeString(pWVar1);
  }
  pWVar1 = (this->ei).bstrHelpFile;
  if (pWVar1 != (BSTR)0x0) {
    SysFreeString(pWVar1);
  }
  (this->ei).pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  *(undefined8 *)&(this->ei).scode = 0;
  *(undefined8 *)&(this->ei).dwHelpContext = 0;
  (this->ei).pvReserved = (PVOID)0x0;
  (this->ei).bstrDescription = (BSTR)0x0;
  (this->ei).bstrHelpFile = (BSTR)0x0;
  (this->ei).wCode = 0;
  (this->ei).wReserved = 0;
  *(undefined4 *)&(this->ei).field_0x4 = 0;
  (this->ei).bstrSource = (BSTR)0x0;
  return;
}

Assistant:

void ScriptException::Free(void)
{
    ichMin = ichLim = 0;
    FreeExcepInfo(&ei);
}